

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

void pageant_conn_log(PageantClient *pc,PageantClientRequestId *reqid,char *fmt,__va_list_tag *ap)

{
  char *ptr;
  
  ptr = dupvprintf(fmt,ap);
  pageant_listener_client_log
            (*(PageantListenerClient **)&pc[-0x2aaf].suppress_logging,"c#%zu,r#%zu: %s",pc[-3].info,
             *(undefined8 *)(reqid + -4),ptr);
  safefree(ptr);
  return;
}

Assistant:

static void pageant_conn_log(PageantClient *pc, PageantClientRequestId *reqid,
                             const char *fmt, va_list ap)
{
    struct pageant_conn_state *pcs =
        container_of(pc, struct pageant_conn_state, pc);
    struct pageant_conn_queued_response *qr =
        container_of(reqid, struct pageant_conn_queued_response, reqid);

    char *formatted = dupvprintf(fmt, ap);
    pageant_listener_client_log(pcs->plc, "c#%"SIZEu",r#%"SIZEu": %s",
                                pcs->conn_index, qr->req_index, formatted);
    sfree(formatted);
}